

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

bool __thiscall QMap<QString,_QString>::contains(QMap<QString,_QString> *this,QString *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  const_iterator i;
  map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
  *in_stack_ffffffffffffffb8;
  bool local_19;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                      *)0x14392f);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                  *)0x143950);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x143961);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                  *)0x143970);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
         ::end(in_stack_ffffffffffffffb8);
    local_19 = std::operator!=(&local_10,&local_18);
  }
  else {
    local_19 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool contains(const Key &key) const
    {
        if (!d)
            return false;
        auto i = d->m.find(key);
        return i != d->m.end();
    }